

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config.c
# Opt level: O1

int get_av1config_from_obu(uint8_t *buffer,size_t length,int is_annexb,Av1Config *config)

{
  bool bVar1;
  int bits;
  void *pvVar2;
  uint8_t uVar3;
  aom_codec_err_t aVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint8_t uVar9;
  ulong uVar10;
  int iVar11;
  char *pcVar12;
  char cVar13;
  int iVar14;
  int result;
  size_t obu_header_length;
  size_t sequence_header_length;
  ObuHeader obu_header;
  int local_b0;
  int local_ac;
  aom_read_bit_buffer local_a8;
  uint local_7c;
  int local_78;
  int local_74;
  int local_70;
  uint local_6c;
  size_t local_68;
  size_t local_60;
  ObuHeader local_58;
  
  if (config == (Av1Config *)0x0 || (length == 0 || buffer == (uint8_t *)0x0)) {
    return -1;
  }
  local_58.has_extension = 0;
  local_58.temporal_layer_id = 0;
  local_58.spatial_layer_id = 0;
  local_58._28_4_ = 0;
  local_58.size = 0;
  local_58.type = 0;
  local_58._9_3_ = 0;
  local_58.has_size_field = 0;
  local_60 = 0;
  local_68 = 0;
  aVar4 = aom_read_obu_header_and_size(buffer,length,is_annexb,&local_58,&local_60,&local_68);
  if (aVar4 != AOM_CODEC_OK) {
    return -1;
  }
  if (local_58.type != OBU_SEQUENCE_HEADER) {
    return -1;
  }
  if (length < local_68 + local_60) {
    return -1;
  }
  config->marker = '\0';
  config->version = '\0';
  config->seq_profile = '\0';
  config->seq_level_idx_0 = '\0';
  config->seq_tier_0 = '\0';
  config->high_bitdepth = '\0';
  config->twelve_bit = '\0';
  config->monochrome = '\0';
  config->high_bitdepth = '\0';
  config->twelve_bit = '\0';
  config->monochrome = '\0';
  config->chroma_subsampling_x = '\0';
  config->chroma_subsampling_y = '\0';
  config->chroma_sample_position = '\0';
  config->initial_presentation_delay_present = '\0';
  config->initial_presentation_delay_minus_one = '\0';
  config->marker = '\x01';
  config->version = '\x01';
  local_a8.bit_buffer = buffer + local_68;
  local_a8.error_handler_data = &local_b0;
  local_b0 = 0;
  local_a8.bit_buffer_end = local_a8.bit_buffer + local_60;
  local_a8.bit_offset = 0;
  local_a8.error_handler = bitreader_error_handler;
  uVar5 = aom_rb_read_literal(&local_a8,3);
  if (local_b0 == -1) {
    pcVar12 = "av1c: Could not read bits for seq_profile, value=%d result=%d.\n";
  }
  else {
    config->seq_profile = (uint8_t)uVar5;
    uVar5 = aom_rb_read_bit(&local_a8);
    if (local_b0 == -1) {
      pcVar12 = "av1c: Error reading bit for still_picture, value=%d result=%d.\n";
    }
    else {
      uVar6 = aom_rb_read_bit(&local_a8);
      if (local_b0 == -1) {
        pcVar12 = "av1c: Error reading bit for reduced_still_picture_header, value=%d result=%d.\n";
LAB_00120a1d:
        uVar10 = (ulong)uVar6;
        goto LAB_00121382;
      }
      if (uVar6 == 0) {
        uVar5 = aom_rb_read_bit(&local_a8);
        pvVar2 = local_a8.error_handler_data;
        if (local_b0 == -1) {
          pcVar12 = "av1c: Error reading bit for timing_info_present_flag, value=%d result=%d.\n";
          goto LAB_0012137a;
        }
        if (uVar5 == 0) {
          local_78 = 0;
          local_74 = 0;
        }
        else {
          local_ac = 0;
          local_a8.error_handler_data = &local_ac;
          uVar5 = aom_rb_read_literal(&local_a8,0x20);
          if (local_ac == -1) {
            pcVar12 = 
            "av1c: Could not read bits for num_units_in_display_tick, value=%d result=%d.\n";
LAB_00120b87:
            fprintf(_stderr,pcVar12,(ulong)uVar5,0xffffffff);
            iVar11 = -1;
            pvVar2 = local_a8.error_handler_data;
          }
          else {
            uVar5 = aom_rb_read_literal(&local_a8,0x20);
            if (local_ac == -1) {
              pcVar12 = "av1c: Could not read bits for time_scale, value=%d result=%d.\n";
              goto LAB_00120b87;
            }
            uVar5 = aom_rb_read_bit(&local_a8);
            if (local_ac == -1) {
              pcVar12 = "av1c: Error reading bit for equal_picture_interval, value=%d result=%d.\n";
              goto LAB_00120b87;
            }
            iVar11 = local_ac;
            if ((uVar5 != 0) &&
               (uVar8 = aom_rb_read_uvlc(&local_a8), iVar11 = local_ac, local_ac == -1)) {
              fprintf(_stderr,
                      "av1c: Could not read bits for num_ticks_per_picture_minus_1, value=%u.\n",
                      (ulong)uVar8);
              iVar11 = local_ac;
              pvVar2 = local_a8.error_handler_data;
            }
          }
          local_a8.error_handler_data = pvVar2;
          if (iVar11 != 0) {
            return -1;
          }
          local_7c = uVar6;
          uVar5 = aom_rb_read_bit(&local_a8);
          pvVar2 = local_a8.error_handler_data;
          if (local_b0 == -1) {
            bVar1 = false;
            fprintf(_stderr,
                    "av1c: Error reading bit for decoder_model_info_present_flag, value=%d result=%d.\n"
                    ,(ulong)uVar5,0xffffffff);
            local_78 = 0;
LAB_00120ed4:
            local_74 = 0;
          }
          else {
            local_78 = 1;
            bVar1 = true;
            if (uVar5 == 0) goto LAB_00120ed4;
            local_ac = 0;
            local_a8.error_handler_data = &local_ac;
            uVar5 = aom_rb_read_literal(&local_a8,5);
            if (local_ac == -1) {
              pcVar12 = 
              "av1c: Could not read bits for buffer_delay_length_minus_1, value=%d result=%d.\n";
              uVar6 = uVar5;
LAB_00121003:
              fprintf(_stderr,pcVar12,(ulong)uVar6,0xffffffff);
              local_74 = -1;
            }
            else {
              uVar6 = aom_rb_read_literal(&local_a8,0x20);
              if (local_ac == -1) {
                pcVar12 = 
                "av1c: Could not read bits for num_units_in_decoding_tick, value=%d result=%d.\n";
                goto LAB_00121003;
              }
              uVar6 = aom_rb_read_literal(&local_a8,5);
              if (local_ac == -1) {
                pcVar12 = 
                "av1c: Could not read bits for buffer_removal_time_length_minus_1, value=%d result=%d.\n"
                ;
                goto LAB_00121003;
              }
              uVar6 = aom_rb_read_literal(&local_a8,5);
              if (local_ac == -1) {
                pcVar12 = 
                "av1c: Could not read bits for frame_presentation_time_length_minus_1, value=%d result=%d.\n"
                ;
                goto LAB_00121003;
              }
              local_74 = uVar5 + 1;
              local_a8.error_handler_data = pvVar2;
            }
            if (local_74 == -1) {
              local_74 = -1;
              bVar1 = false;
              local_78 = 0;
            }
          }
          uVar6 = local_7c;
          if (!bVar1) {
            return -1;
          }
        }
        uVar5 = aom_rb_read_bit(&local_a8);
        if (local_b0 == -1) {
          pcVar12 = 
          "av1c: Error reading bit for initial_presentation_delay_present, value=%d result=%d.\n";
          goto LAB_0012137a;
        }
        config->initial_presentation_delay_present = (uint8_t)uVar5;
        uVar7 = aom_rb_read_literal(&local_a8,5);
        if (local_b0 != -1) {
          local_7c = uVar6;
          if (-1 < (int)uVar7) {
            local_74 = local_74 + 1;
            iVar11 = uVar7 + 1;
            iVar14 = 0;
            local_70 = iVar11;
            do {
              uVar5 = aom_rb_read_literal(&local_a8,0xc);
              if (local_b0 == -1) {
                pcVar12 = "av1c: Could not read bits for operating_point_idc, value=%d result=%d.\n"
                ;
                goto LAB_0012137a;
              }
              uVar6 = aom_rb_read_literal(&local_a8,5);
              uVar10 = (ulong)uVar6;
              if (local_b0 == -1) {
                pcVar12 = "av1c: Could not read bits for seq_level_idx, value=%d result=%d.\n";
                goto LAB_00121382;
              }
              uVar5 = 0;
              if (7 < (int)uVar6) {
                uVar5 = aom_rb_read_bit(&local_a8);
                if (local_b0 == -1) {
                  fprintf(_stderr,
                          "av1c: Error reading bit for seq_tier_this_op, value=%d result=%d.\n",
                          (ulong)uVar5,0xffffffff);
                  return -1;
                }
              }
              pvVar2 = local_a8.error_handler_data;
              local_6c = uVar5;
              if (local_78 != 0) {
                uVar5 = aom_rb_read_bit(&local_a8);
                bits = local_74;
                pvVar2 = local_a8.error_handler_data;
                if (local_b0 == -1) {
                  pcVar12 = 
                  "av1c: Error reading bit for decoder_model_present_for_op, value=%d result=%d.\n";
                  goto LAB_0012137a;
                }
                if (uVar5 != 0) {
                  local_ac = 0;
                  local_a8.error_handler_data = &local_ac;
                  uVar5 = aom_rb_read_literal(&local_a8,local_74);
                  if (local_ac == -1) {
                    pcVar12 = 
                    "av1c: Could not read bits for decoder_buffer_delay, value=%d result=%d.\n";
LAB_00121356:
                    fprintf(_stderr,pcVar12,(ulong)uVar5,0xffffffff);
                    return -1;
                  }
                  uVar5 = aom_rb_read_literal(&local_a8,bits);
                  if (local_ac == -1) {
                    pcVar12 = 
                    "av1c: Could not read bits for encoder_buffer_delay, value=%d result=%d.\n";
                    goto LAB_00121356;
                  }
                  uVar5 = aom_rb_read_bit(&local_a8);
                  iVar11 = local_70;
                  if (local_ac == -1) {
                    pcVar12 = 
                    "av1c: Error reading bit for low_delay_mode_flag, value=%d result=%d.\n";
                    goto LAB_00121356;
                  }
                }
              }
              local_a8.error_handler_data = pvVar2;
              if (config->initial_presentation_delay_present != '\0') {
                uVar5 = aom_rb_read_bit(&local_a8);
                if (local_b0 == -1) {
                  pcVar12 = 
                  "av1c: Error reading bit for initial_presentation_delay_present_for_this_op, value=%d result=%d.\n"
                  ;
                  goto LAB_0012137a;
                }
                if ((uVar5 != 0) && (uVar5 = aom_rb_read_literal(&local_a8,4), local_b0 == -1)) {
                  pcVar12 = 
                  "av1c: Could not read bits for initial_presentation_delay_minus_1, value=%d result=%d.\n"
                  ;
                  goto LAB_0012137a;
                }
              }
              if (iVar14 == 0) {
                config->seq_level_idx_0 = (uint8_t)uVar6;
                config->seq_tier_0 = (uint8_t)local_6c;
                config->initial_presentation_delay_present = '\0';
                config->initial_presentation_delay_minus_one = '\0';
              }
              iVar14 = iVar14 + 1;
            } while (iVar11 != iVar14);
          }
          goto LAB_001204ae;
        }
        pcVar12 = 
        "av1c: Could not read bits for operating_points_cnt_minus_1, value=%d result=%d.\n";
LAB_00121229:
        uVar10 = (ulong)uVar7;
        goto LAB_00121382;
      }
      config->initial_presentation_delay_present = '\0';
      uVar5 = aom_rb_read_literal(&local_a8,5);
      if (local_b0 == -1) {
        local_7c = uVar6;
        fprintf(_stderr,"av1c: Could not read bits for seq_level_idx_0, value=%d result=%d.\n",
                (ulong)uVar5,0xffffffff);
        return -1;
      }
      config->seq_level_idx_0 = (uint8_t)uVar5;
      config->seq_tier_0 = '\0';
      local_7c = uVar6;
LAB_001204ae:
      uVar6 = aom_rb_read_literal(&local_a8,4);
      if (local_b0 == -1) {
        pcVar12 = "av1c: Could not read bits for frame_width_bits_minus_1, value=%d result=%d.\n";
        goto LAB_00120a1d;
      }
      uVar7 = aom_rb_read_literal(&local_a8,4);
      if (local_b0 == -1) {
        pcVar12 = "av1c: Could not read bits for frame_height_bits_minus_1, value=%d result=%d.\n";
        goto LAB_00121229;
      }
      uVar5 = aom_rb_read_literal(&local_a8,uVar6 + 1);
      if (local_b0 == -1) {
        pcVar12 = "av1c: Could not read bits for max_frame_width_minus_1, value=%d result=%d.\n";
      }
      else {
        uVar5 = aom_rb_read_literal(&local_a8,uVar7 + 1);
        uVar6 = local_7c;
        if (local_b0 == -1) {
          pcVar12 = "av1c: Could not read bits for max_frame_height_minus_1, value=%d result=%d.\n";
        }
        else {
          if (local_7c == 0) {
            uVar5 = aom_rb_read_bit(&local_a8);
            if (local_b0 == -1) {
              fprintf(_stderr,
                      "av1c: Error reading bit for frame_id_numbers_present_flag, value=%d result=%d.\n"
                      ,(ulong)uVar5,0xffffffff);
              return -1;
            }
          }
          else {
            uVar5 = 0;
          }
          if ((char)uVar5 == '\0') {
LAB_00120643:
            uVar5 = aom_rb_read_bit(&local_a8);
            if (local_b0 == -1) {
              pcVar12 = "av1c: Error reading bit for use_128x128_superblock, value=%d result=%d.\n";
            }
            else {
              uVar5 = aom_rb_read_bit(&local_a8);
              if (local_b0 == -1) {
                pcVar12 = "av1c: Error reading bit for enable_filter_intra, value=%d result=%d.\n";
              }
              else {
                uVar5 = aom_rb_read_bit(&local_a8);
                if (local_b0 == -1) {
                  pcVar12 = 
                  "av1c: Error reading bit for enable_intra_edge_filter, value=%d result=%d.\n";
                }
                else if (uVar6 == 0) {
                  uVar5 = aom_rb_read_bit(&local_a8);
                  if (local_b0 == -1) {
                    pcVar12 = 
                    "av1c: Error reading bit for enable_interintra_compound, value=%d result=%d.\n";
                  }
                  else {
                    uVar5 = aom_rb_read_bit(&local_a8);
                    if (local_b0 == -1) {
                      pcVar12 = 
                      "av1c: Error reading bit for enable_masked_compound, value=%d result=%d.\n";
                    }
                    else {
                      uVar5 = aom_rb_read_bit(&local_a8);
                      if (local_b0 == -1) {
                        pcVar12 = 
                        "av1c: Error reading bit for enable_warped_motion, value=%d result=%d.\n";
                      }
                      else {
                        uVar5 = aom_rb_read_bit(&local_a8);
                        if (local_b0 == -1) {
                          pcVar12 = 
                          "av1c: Error reading bit for enable_dual_filter, value=%d result=%d.\n";
                        }
                        else {
                          uVar7 = aom_rb_read_bit(&local_a8);
                          if (local_b0 == -1) {
                            pcVar12 = 
                            "av1c: Error reading bit for enable_order_hint, value=%d result=%d.\n";
                            goto LAB_00121229;
                          }
                          if (uVar7 == 0) {
LAB_001207c5:
                            uVar5 = aom_rb_read_bit(&local_a8);
                            uVar10 = (ulong)uVar5;
                            if (local_b0 == -1) {
                              pcVar12 = 
                              "av1c: Error reading bit for seq_choose_screen_content_tools, value=%d result=%d.\n"
                              ;
                              goto LAB_00121382;
                            }
                            uVar6 = 2;
                            if ((uVar5 == 0) && (uVar6 = aom_rb_read_bit(&local_a8), local_b0 == -1)
                               ) {
                              fprintf(_stderr,
                                      "av1c: Error reading bit for seq_force_screen_content_tools_val, value=%d result=%d.\n"
                                      ,(ulong)uVar6,0xffffffff);
                              return -1;
                            }
                            if ((int)uVar6 < 1) {
LAB_0012083a:
                              if ((uVar7 == 0) ||
                                 (uVar5 = aom_rb_read_literal(&local_a8,3), local_b0 != -1))
                              goto LAB_0012068b;
                              pcVar12 = 
                              "av1c: Could not read bits for order_hint_bits_minus_1, value=%d result=%d.\n"
                              ;
                            }
                            else {
                              uVar5 = aom_rb_read_bit(&local_a8);
                              if (local_b0 == -1) {
                                pcVar12 = 
                                "av1c: Error reading bit for seq_choose_integer_mv, value=%d result=%d.\n"
                                ;
                              }
                              else {
                                if ((uVar5 != 0) ||
                                   (uVar5 = aom_rb_read_bit(&local_a8), local_b0 != -1))
                                goto LAB_0012083a;
                                pcVar12 = 
                                "av1c: Error reading bit for seq_force_integer_mv, value=%d result=%d.\n"
                                ;
                              }
                            }
                          }
                          else {
                            uVar5 = aom_rb_read_bit(&local_a8);
                            if (local_b0 == -1) {
                              pcVar12 = 
                              "av1c: Error reading bit for enable_dist_wtd_comp, value=%d result=%d.\n"
                              ;
                            }
                            else {
                              uVar5 = aom_rb_read_bit(&local_a8);
                              if (local_b0 != -1) goto LAB_001207c5;
                              pcVar12 = 
                              "av1c: Error reading bit for enable_ref_frame_mvs, value=%d result=%d.\n"
                              ;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                else {
LAB_0012068b:
                  uVar5 = aom_rb_read_bit(&local_a8);
                  if (local_b0 == -1) {
                    pcVar12 = "av1c: Error reading bit for enable_superres, value=%d result=%d.\n";
                  }
                  else {
                    uVar5 = aom_rb_read_bit(&local_a8);
                    if (local_b0 == -1) {
                      pcVar12 = "av1c: Error reading bit for enable_cdef, value=%d result=%d.\n";
                    }
                    else {
                      uVar5 = aom_rb_read_bit(&local_a8);
                      pvVar2 = local_a8.error_handler_data;
                      if (local_b0 != -1) {
                        local_a8.error_handler_data = &local_ac;
                        local_ac = 0;
                        uVar5 = aom_rb_read_bit(&local_a8);
                        if (local_ac == -1) {
                          pcVar12 = 
                          "av1c: Error reading bit for high_bitdepth, value=%d result=%d.\n";
                        }
                        else {
                          uVar3 = (uint8_t)uVar5;
                          config->high_bitdepth = uVar3;
                          if (uVar3 == '\0' || config->seq_profile != '\x02') {
                            cVar13 = (uVar3 != '\0') * '\x02' + '\b';
                          }
                          else {
                            uVar5 = aom_rb_read_bit(&local_a8);
                            if (local_ac == -1) {
                              fprintf(_stderr,
                                      "av1c: Error reading bit for twelve_bit, value=%d result=%d.\n"
                                      ,(ulong)uVar5,0xffffffff);
                              goto LAB_001212cc;
                            }
                            config->twelve_bit = (uint8_t)uVar5;
                            cVar13 = ((uint8_t)uVar5 != '\0') * '\x02' + '\n';
                          }
                          if (config->seq_profile != '\x01') {
                            uVar5 = aom_rb_read_bit(&local_a8);
                            if (local_ac == -1) {
                              fprintf(_stderr,
                                      "av1c: Error reading bit for mono_chrome, value=%d result=%d.\n"
                                      ,(ulong)uVar5,0xffffffff);
                              goto LAB_001212cc;
                            }
                            config->monochrome = (uint8_t)uVar5;
                          }
                          uVar5 = aom_rb_read_bit(&local_a8);
                          if (local_ac == -1) {
                            pcVar12 = 
                            "av1c: Error reading bit for color_description_present_flag, value=%d result=%d.\n"
                            ;
                          }
                          else {
                            if (uVar5 == 0) {
                              uVar5 = 2;
                              uVar6 = 2;
                              uVar7 = 2;
                            }
                            else {
                              uVar5 = aom_rb_read_literal(&local_a8,8);
                              if (local_ac == -1) {
                                fprintf(_stderr,
                                        "av1c: Could not read bits for color_primaries_val, value=%d result=%d.\n"
                                        ,(ulong)uVar5,0xffffffff);
                                uVar5 = 2;
LAB_00120e62:
                                uVar6 = 2;
LAB_00120efd:
                                bVar1 = false;
                                uVar7 = 2;
                              }
                              else {
                                uVar6 = aom_rb_read_literal(&local_a8,8);
                                if (local_ac == -1) {
                                  fprintf(_stderr,
                                          "av1c: Could not read bits for transfer_characteristics_val, value=%d result=%d.\n"
                                          ,(ulong)uVar6,0xffffffff);
                                  goto LAB_00120e62;
                                }
                                uVar7 = aom_rb_read_literal(&local_a8,8);
                                bVar1 = local_ac != -1;
                                if (local_ac == -1) {
                                  fprintf(_stderr,
                                          "av1c: Could not read bits for matrix_coefficients_val, value=%d result=%d.\n"
                                          ,(ulong)uVar7,0xffffffff);
                                  goto LAB_00120efd;
                                }
                              }
                              if (!bVar1) goto LAB_001212cc;
                            }
                            if (config->monochrome == '\0') {
                              if ((uVar6 == 0xd && uVar5 == 1) && uVar7 == 0) {
                                config->chroma_subsampling_x = '\0';
                                config->chroma_subsampling_y = '\0';
                              }
                              else {
                                uVar5 = aom_rb_read_bit(&local_a8);
                                if (local_ac == -1) {
                                  pcVar12 = 
                                  "av1c: Error reading bit for color_range, value=%d result=%d.\n";
                                  goto LAB_001212be;
                                }
                                uVar3 = '\x01';
                                if (config->seq_profile == '\0') {
                                  uVar9 = '\x01';
LAB_00120d14:
                                  config->chroma_subsampling_x = uVar3;
LAB_00120d17:
                                  config->chroma_subsampling_y = uVar9;
                                }
                                else {
                                  if (config->seq_profile == '\x01') {
                                    uVar3 = '\0';
LAB_00120d12:
                                    uVar9 = '\0';
                                    goto LAB_00120d14;
                                  }
                                  uVar3 = '\x01';
                                  if (cVar13 != '\f') goto LAB_00120d12;
                                  uVar5 = aom_rb_read_bit(&local_a8);
                                  if (local_ac == -1) {
                                    pcVar12 = 
                                    "av1c: Error reading bit for subsampling_x, value=%d result=%d.\n"
                                    ;
                                    goto LAB_001212be;
                                  }
                                  config->chroma_subsampling_x = (uint8_t)uVar5;
                                  if (uVar5 == 0) {
                                    uVar9 = '\0';
                                    goto LAB_00120d17;
                                  }
                                  uVar5 = aom_rb_read_bit(&local_a8);
                                  if (local_ac == -1) {
                                    fprintf(_stderr,
                                            "av1c: Error reading bit for subsampling_y, value=%d result=%d.\n"
                                            ,(ulong)uVar5,0xffffffff);
                                    goto LAB_001212cc;
                                  }
                                  config->chroma_subsampling_y = (uint8_t)uVar5;
                                }
                                if ((config->chroma_subsampling_x != '\0') &&
                                   (config->chroma_subsampling_y != '\0')) {
                                  uVar5 = aom_rb_read_literal(&local_a8,2);
                                  if (local_ac == -1) {
                                    pcVar12 = 
                                    "av1c: Could not read bits for chroma_sample_position, value=%d result=%d.\n"
                                    ;
                                    goto LAB_00120e2c;
                                  }
                                  config->chroma_sample_position = (uint8_t)uVar5;
                                  iVar11 = local_ac;
                                  goto LAB_001209c0;
                                }
                              }
                            }
                            else {
                              uVar5 = aom_rb_read_bit(&local_a8);
                              if (local_ac == -1) {
                                pcVar12 = 
                                "av1c: Error reading bit for color_range, value=%d result=%d.\n";
LAB_00120e2c:
                                iVar11 = local_ac;
                                fprintf(_stderr,pcVar12,(ulong)uVar5,0xffffffff);
                              }
                              else {
                                config->chroma_subsampling_x = '\x01';
                                config->chroma_subsampling_y = '\x01';
                                iVar11 = local_ac;
                              }
LAB_001209c0:
                              if (iVar11 == -1) goto LAB_001212cc;
                            }
                            if ((config->monochrome != '\0') ||
                               (uVar5 = aom_rb_read_bit(&local_a8), local_ac != -1)) {
                              local_a8.error_handler_data = pvVar2;
                              if (local_ac != 0) goto LAB_001212cc;
                              uVar5 = aom_rb_read_bit(&local_a8);
                              if (local_b0 != -1) {
                                return 0;
                              }
                              pcVar12 = 
                              "av1c: Error reading bit for film_grain_params_present, value=%d result=%d.\n"
                              ;
                              goto LAB_0012137a;
                            }
                            pcVar12 = 
                            "av1c: Error reading bit for separate_uv_delta_q, value=%d result=%d.\n"
                            ;
                          }
                        }
LAB_001212be:
                        fprintf(_stderr,pcVar12,(ulong)uVar5,0xffffffff);
LAB_001212cc:
                        get_av1config_from_obu_cold_1();
                        return -1;
                      }
                      pcVar12 = 
                      "av1c: Error reading bit for enable_restoration, value=%d result=%d.\n";
                    }
                  }
                }
              }
            }
          }
          else {
            uVar5 = aom_rb_read_literal(&local_a8,4);
            if (local_b0 == -1) {
              pcVar12 = 
              "av1c: Could not read bits for delta_frame_id_length_minus_2, value=%d result=%d.\n";
            }
            else {
              uVar5 = aom_rb_read_literal(&local_a8,3);
              if (local_b0 != -1) goto LAB_00120643;
              pcVar12 = 
              "av1c: Could not read bits for additional_frame_id_length_minus_1, value=%d result=%d.\n"
              ;
            }
          }
        }
      }
    }
  }
LAB_0012137a:
  uVar10 = (ulong)uVar5;
LAB_00121382:
  fprintf(_stderr,pcVar12,uVar10,0xffffffff);
  return -1;
}

Assistant:

int get_av1config_from_obu(const uint8_t *buffer, size_t length, int is_annexb,
                           Av1Config *config) {
  if (!buffer || length == 0 || !config) {
    return -1;
  }

  ObuHeader obu_header;
  memset(&obu_header, 0, sizeof(obu_header));

  size_t sequence_header_length = 0;
  size_t obu_header_length = 0;
  if (aom_read_obu_header_and_size(buffer, length, is_annexb, &obu_header,
                                   &sequence_header_length,
                                   &obu_header_length) != AOM_CODEC_OK ||
      obu_header.type != OBU_SEQUENCE_HEADER ||
      sequence_header_length + obu_header_length > length) {
    return -1;
  }

  memset(config, 0, sizeof(*config));
  config->marker = 1;
  config->version = 1;
  return parse_sequence_header(buffer + obu_header_length,
                               sequence_header_length, config);
}